

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_dns_parse.c
# Opt level: O3

ares_status_t ares_dns_parse(uchar *buf,size_t buf_len,uint flags,ares_dns_record_t **dnsrec)

{
  ares_dns_record_t *paVar1;
  ares_status_t aVar2;
  ares_bool_t aVar3;
  ares_buf_t *buf_00;
  size_t sVar4;
  ushort uVar5;
  ares_dns_rec_type_t qtype;
  int iVar6;
  unsigned_short nscount;
  unsigned_short ancount;
  unsigned_short qdcount;
  unsigned_short u16;
  unsigned_short local_4a;
  unsigned_short local_48;
  unsigned_short local_46;
  unsigned_short local_44;
  unsigned_short local_42;
  char *local_40;
  int local_34;
  
  if (dnsrec == (ares_dns_record_t **)0x0 || (buf_len == 0 || buf == (uchar *)0x0)) {
    return ARES_EFORMERR;
  }
  buf_00 = ares_buf_create_const(buf,buf_len);
  if (buf_00 == (ares_buf_t *)0x0) {
    return ARES_ENOMEM;
  }
  sVar4 = ares_buf_len(buf_00);
  aVar2 = ARES_EFORMERR;
  if (0xffff < sVar4) goto LAB_00120b5a;
  *dnsrec = (ares_dns_record_t *)0x0;
  aVar2 = ares_buf_fetch_be16(buf_00,&local_4a);
  if ((aVar2 == ARES_SUCCESS) &&
     (aVar2 = ares_buf_fetch_be16(buf_00,(unsigned_short *)&local_40), aVar2 == ARES_SUCCESS)) {
    uVar5 = (ushort)local_40;
    aVar2 = ares_buf_fetch_be16(buf_00,&local_42);
    if ((aVar2 != ARES_SUCCESS) ||
       ((((aVar2 = ares_buf_fetch_be16(buf_00,&local_44), aVar2 != ARES_SUCCESS ||
          (aVar2 = ares_buf_fetch_be16(buf_00,&local_46), aVar2 != ARES_SUCCESS)) ||
         (aVar2 = ares_buf_fetch_be16(buf_00,&local_48), aVar2 != ARES_SUCCESS)) ||
        (aVar2 = ares_dns_record_create
                           (dnsrec,local_4a,
                            uVar5 * 4 & 0x40 |
                            uVar5 & 0x20 | uVar5 >> 0xf | uVar5 >> 9 & 2 | uVar5 >> 7 & 4 |
                            uVar5 >> 5 & 8 | uVar5 >> 3 & 0x10,uVar5 >> 0xb & 0xf,ARES_RCODE_NOERROR
                           ), aVar2 != ARES_SUCCESS)))) goto LAB_00120b23;
    paVar1 = *dnsrec;
    paVar1->raw_rcode = uVar5 & 0xf;
    if (((((ulong)local_44 != 0) &&
         (aVar2 = ares_dns_record_rr_prealloc(paVar1,ARES_SECTION_ANSWER,(ulong)local_44),
         aVar2 != ARES_SUCCESS)) ||
        (((ulong)local_46 != 0 &&
         (aVar2 = ares_dns_record_rr_prealloc(*dnsrec,ARES_SECTION_AUTHORITY,(ulong)local_46),
         aVar2 != ARES_SUCCESS)))) ||
       (((ulong)local_48 != 0 &&
        (aVar2 = ares_dns_record_rr_prealloc(*dnsrec,ARES_SECTION_ADDITIONAL,(ulong)local_48),
        aVar2 != ARES_SUCCESS)))) goto LAB_00120b23;
    aVar2 = ARES_EBADRESP;
    if (local_42 == 1) {
      iVar6 = 0;
      do {
        paVar1 = *dnsrec;
        local_40 = (char *)0x0;
        aVar2 = ares_dns_name_parse(buf_00,&local_40,ARES_FALSE);
        if ((aVar2 != ARES_SUCCESS) ||
           (local_34 = iVar6, aVar2 = ares_buf_fetch_be16(buf_00,&local_4a), aVar2 != ARES_SUCCESS))
        {
LAB_00120d2e:
          ares_free(local_40);
          goto LAB_00120b4b;
        }
        qtype = (ares_dns_rec_type_t)local_4a;
        aVar2 = ares_buf_fetch_be16(buf_00,&local_4a);
        if (aVar2 != ARES_SUCCESS) goto LAB_00120d2e;
        aVar2 = ares_dns_record_query_add(paVar1,local_40,qtype,(uint)local_4a);
        ares_free(local_40);
        if (aVar2 != ARES_SUCCESS) goto LAB_00120b4b;
        iVar6 = local_34 + 1;
      } while ((ushort)iVar6 < local_42);
      if (local_44 != 0) {
        uVar5 = 0;
        do {
          aVar2 = ares_dns_parse_rr(buf_00,flags,ARES_SECTION_ANSWER,*dnsrec);
          if (aVar2 != ARES_SUCCESS) goto LAB_00120b4b;
          uVar5 = uVar5 + 1;
        } while (uVar5 < local_44);
      }
      if (local_46 != 0) {
        uVar5 = 0;
        do {
          aVar2 = ares_dns_parse_rr(buf_00,flags,ARES_SECTION_AUTHORITY,*dnsrec);
          if (aVar2 != ARES_SUCCESS) goto LAB_00120b4b;
          uVar5 = uVar5 + 1;
        } while (uVar5 < local_46);
      }
      if (local_48 != 0) {
        uVar5 = 0;
        do {
          aVar2 = ares_dns_parse_rr(buf_00,flags,ARES_SECTION_ADDITIONAL,*dnsrec);
          if (aVar2 != ARES_SUCCESS) goto LAB_00120b4b;
          uVar5 = uVar5 + 1;
        } while (uVar5 < local_48);
      }
      aVar3 = ares_dns_rcode_isvalid((uint)(*dnsrec)->raw_rcode);
      paVar1 = *dnsrec;
      if (aVar3 == ARES_FALSE) {
        paVar1->rcode = ARES_RCODE_SERVFAIL;
      }
      else {
        paVar1->rcode = (uint)paVar1->raw_rcode;
      }
      aVar2 = ARES_SUCCESS;
      goto LAB_00120b5a;
    }
  }
  else {
LAB_00120b23:
    ares_dns_record_destroy(*dnsrec);
    *dnsrec = (ares_dns_record_t *)0x0;
    local_42 = 0;
    local_44 = 0;
    local_46 = 0;
    local_48 = 0;
  }
LAB_00120b4b:
  ares_dns_record_destroy(*dnsrec);
  *dnsrec = (ares_dns_record_t *)0x0;
LAB_00120b5a:
  ares_buf_destroy(buf_00);
  return aVar2;
}

Assistant:

ares_status_t ares_dns_parse(const unsigned char *buf, size_t buf_len,
                             unsigned int flags, ares_dns_record_t **dnsrec)
{
  ares_buf_t   *parser = NULL;
  ares_status_t status;

  if (buf == NULL || buf_len == 0 || dnsrec == NULL) {
    return ARES_EFORMERR;
  }

  parser = ares_buf_create_const(buf, buf_len);
  if (parser == NULL) {
    return ARES_ENOMEM;
  }

  status = ares_dns_parse_buf(parser, flags, dnsrec);
  ares_buf_destroy(parser);

  return status;
}